

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O0

float rtosc_secfracs2float(uint64_t secfracs)

{
  ulong in_RDI;
  int rd;
  float flt;
  int written;
  char as_hex_str [16];
  undefined4 local_24;
  float local_20;
  int local_1c;
  char local_18 [24];
  
  local_1c = snprintf(local_18,0x10,"0x%xp-32",in_RDI & 0xffffffff);
  local_24 = 0;
  __isoc99_sscanf(local_18,"%f%n",&local_20,&local_24);
  return local_20;
}

Assistant:

float rtosc_secfracs2float(uint64_t secfracs)
{
    char as_hex_str[16];
    // print as hex string (lossless)
    int written = snprintf(as_hex_str, 16, "0x%xp-32", (unsigned)secfracs);
    assert(written >= 0); // no error
    assert(written < 16); // size suffices
    (void) written;

    float flt;
    int rd = 0;
    // scan hex string as float (can have loss)
    sscanf(as_hex_str, "%f%n", &flt, &rd);
    assert(rd);
    return flt;
}